

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlNodeSetPtr xmlXPathNodeTrailingSorted(xmlNodeSetPtr nodes,xmlNodePtr node)

{
  int iVar1;
  xmlNodeSetPtr cur;
  xmlNodeSetPtr pxVar2;
  xmlNodePtr val;
  ulong uVar3;
  
  pxVar2 = nodes;
  if (node != (xmlNodePtr)0x0) {
    cur = xmlXPathNodeSetCreate((xmlNodePtr)0x0);
    pxVar2 = (xmlNodeSetPtr)0x0;
    if ((((cur != (xmlNodeSetPtr)0x0) && (pxVar2 = cur, nodes != (xmlNodeSetPtr)0x0)) &&
        (nodes->nodeNr != 0)) &&
       ((nodes->nodeTab != (xmlNodePtr *)0x0 &&
        (iVar1 = xmlXPathNodeSetContains(nodes,node), iVar1 != 0)))) {
      uVar3 = (ulong)(uint)nodes->nodeNr;
      do {
        if ((int)uVar3 < 1) break;
        if (nodes->nodeNr < (int)uVar3) {
          val = (xmlNodePtr)0x0;
        }
        else {
          val = nodes->nodeTab[uVar3 - 1];
        }
        if (val == node) break;
        iVar1 = xmlXPathNodeSetAddUnique(cur,val);
        uVar3 = uVar3 - 1;
      } while (-1 < iVar1);
      xmlXPathNodeSetSort(cur);
    }
  }
  return pxVar2;
}

Assistant:

xmlNodeSetPtr
xmlXPathNodeTrailingSorted (xmlNodeSetPtr nodes, xmlNodePtr node) {
    int i, l;
    xmlNodePtr cur;
    xmlNodeSetPtr ret;

    if (node == NULL)
	return(nodes);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(ret);
    if (xmlXPathNodeSetIsEmpty(nodes) ||
	(!xmlXPathNodeSetContains(nodes, node)))
	return(ret);

    l = xmlXPathNodeSetGetLength(nodes);
    for (i = l - 1; i >= 0; i--) {
	cur = xmlXPathNodeSetItem(nodes, i);
	if (cur == node)
	    break;
        /* TODO: Propagate memory error. */
	if (xmlXPathNodeSetAddUnique(ret, cur) < 0)
	    break;
    }
    xmlXPathNodeSetSort(ret);	/* bug 413451 */
    return(ret);
}